

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::~LTAircraft(LTAircraft *this)

{
  (this->super_Aircraft)._vptr_Aircraft = (_func_int **)&PTR__LTAircraft_002bb708;
  if (pExtViewAc == this) {
    ToggleCameraView(this);
  }
  DataRefs::DecNumAc(&dataRefs);
  if ((int)dataRefs.iLogLevel < 2) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x534,"~LTAircraft",logINFO,"Removed aircraft %s",(this->labelInternal)._M_dataplus._M_p
          );
  }
  std::__cxx11::string::~string((string *)&this->nearestAirport);
  std::__cxx11::string::~string((string *)&this->labelInternal);
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  XPMP2::Aircraft::~Aircraft(&this->super_Aircraft);
  return;
}

Assistant:

LTAircraft::~LTAircraft()
{
    // make sure external view doesn't use this aircraft any longer
    if (IsInCameraView())
        ToggleCameraView();
    
    // Decrease number of visible aircraft and log a message about that fact
    dataRefs.DecNumAc();
    LOG_MSG(logINFO,INFO_AC_REMOVED,labelInternal.c_str());
}